

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O2

bool __thiscall
QStringListModel::removeRows(QStringListModel *this,int row,int count,QModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  long in_FS_OFFSET;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row && 0 < count) {
    iVar2 = (**(code **)(*(long *)this + 0x78))(this,parent);
    if (count + row <= iVar2) {
      local_48.r = -1;
      local_48.c = -1;
      local_48.i = 0;
      local_48.m.ptr = (QAbstractItemModel *)0x0;
      QAbstractItemModel::beginRemoveRows((QAbstractItemModel *)this,&local_48,row,count + row + -1)
      ;
      iVar3 = QList<QString>::begin((QList<QString> *)(this + 0x10));
      QList<QString>::erase
                ((QList<QString> *)(this + 0x10),iVar3.i + (uint)row,
                 iVar3.i + (uint)row + (uint)count);
      QAbstractItemModel::endRemoveRows((QAbstractItemModel *)this);
      bVar1 = true;
      goto LAB_0043350f;
    }
  }
  bVar1 = false;
LAB_0043350f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QStringListModel::removeRows(int row, int count, const QModelIndex &parent)
{
    if (count <= 0 || row < 0 || (row + count) > rowCount(parent))
        return false;

    beginRemoveRows(QModelIndex(), row, row + count - 1);

    const auto it = lst.begin() + row;
    lst.erase(it, it + count);

    endRemoveRows();

    return true;
}